

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O3

void __thiscall
StringWriter_WriteThreeByteLengthCharString_Test::TestBody
          (StringWriter_WriteThreeByteLengthCharString_Test *this)

{
  uchar *rhs;
  undefined1 auVar1 [8];
  pointer puVar2;
  pointer puVar3;
  StringWriter_WriteThreeByteLengthCharString_Test *pSVar4;
  void *pvVar5;
  void *__dest;
  ulong uVar6;
  pointer *__ptr;
  char *pcVar7;
  ptrdiff_t _Num;
  size_t __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> body;
  string str;
  AssertHelper local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  pointer local_a8;
  AssertHelper local_a0;
  internal local_98;
  undefined7 uStack_97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  long local_88;
  void *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  StringWriter_WriteThreeByteLengthCharString_Test *local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_78,'\0');
  pstore::serialize::string_helper::
  write<pstore::serialize::archive::vector_writer&,std::__cxx11::string>
            (&(this->super_StringWriter).writer_,&local_78);
  local_b8 = (undefined1  [8])(local_78._M_string_length + 3);
  local_c8.data_ =
       (AssertHelperData *)
       ((this->super_StringWriter).bytes_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
       -(long)(this->super_StringWriter).bytes_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (&local_98,"str.length () + 3","bytes_.size ()",(unsigned_long *)local_b8,
             (unsigned_long *)&local_c8);
  if (local_98 == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x57,pcVar7);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  rhs = (this->super_StringWriter).bytes_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_b8._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            (&local_98,"0b00000100","*(first++)",(int *)local_b8,rhs);
  if (local_98 == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x59,pcVar7);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,unsigned_char>
            (&local_98,"0b00000000","*(first++)",(int *)local_b8,rhs + 1);
  if (local_98 == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x5a,pcVar7);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b8._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            (&local_98,"0b00000010","*(first++)",(int *)local_b8,rhs + 2);
  if (local_98 == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x5b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(rhs + 3),
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->super_StringWriter).bytes_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)local_b8);
  pvVar5 = operator_new(0x4000);
  memset(pvVar5,0x61,0x4000);
  __dest = operator_new(0x4000);
  memcpy(__dest,pvVar5,0x4000);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            (&local_58,0x4000);
  puVar2 = local_58._M_impl.super__Vector_impl_data._M_start;
  memmove(local_58._M_impl.super__Vector_impl_data._M_start,__dest,0x4000);
  local_58._M_impl.super__Vector_impl_data._M_finish = puVar2 + 0x4000;
  operator_delete(__dest,0x4000);
  uVar6 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
          (long)local_58._M_impl.super__Vector_impl_data._M_start;
  local_80 = pvVar5;
  local_38 = this;
  if (uVar6 == 0) {
    pvVar5 = (void *)0x0;
    __n = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pvVar5 = operator_new(uVar6);
    __n = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
          (long)local_58._M_impl.super__Vector_impl_data._M_start;
  }
  puVar3 = local_58._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = local_58._M_impl.super__Vector_impl_data._M_start;
  if (local_58._M_impl.super__Vector_impl_data._M_finish !=
      local_58._M_impl.super__Vector_impl_data._M_start) {
    memmove(pvVar5,local_58._M_impl.super__Vector_impl_data._M_start,__n);
  }
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8 = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,__n);
  auVar1 = local_b8;
  if (puVar3 != puVar2) {
    memmove((void *)local_b8,pvVar5,__n);
  }
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)auVar1 + __n);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,uVar6);
  }
  pvVar5 = local_80;
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::operator()(&local_c8,local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x171ab5)
  ;
  pSVar4 = local_38;
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8,(long)local_a8 - (long)local_b8);
  }
  if (local_58._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char)local_c8.data_ == '\0') {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x5f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_c8.data_ =
       (AssertHelperData *)
       ((pSVar4->super_StringWriter).bytes_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
       -(long)(pSVar4->super_StringWriter).bytes_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_a0.data_ =
       (AssertHelperData *)
       (pSVar4->super_StringWriter).writer_.
       super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.bytes_consumed_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_b8,"bytes_.size ()","writer_.bytes_consumed ()",
             (unsigned_long *)&local_c8,(unsigned_long *)&local_a0);
  if (local_b8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x60,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_c8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_c8.data_ + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  local_c8.data_ =
       (AssertHelperData *)
       ((pSVar4->super_StringWriter).bytes_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
       -(long)(pSVar4->super_StringWriter).bytes_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_a0.data_ =
       (AssertHelperData *)
       (pSVar4->super_StringWriter).writer_.
       super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.bytes_consumed_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_b8,"bytes_.size ()","writer_.bytes_produced ()",
             (unsigned_long *)&local_c8,(unsigned_long *)&local_a0);
  if (local_b8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x61,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_c8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_c8.data_ + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  operator_delete(pvVar5,0x4000);
  pvVar5 = (void *)CONCAT71(uStack_97,local_98);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,local_88 - (long)pvVar5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_F (StringWriter, WriteThreeByteLengthCharString) {
    auto const src_length = three_byte_varint;
    auto const src_char = 'a';
    std::string const str (src_length, src_char);

    pstore::serialize::write (writer_, str);

    EXPECT_EQ (str.length () + 3, bytes_.size ());
    auto first = std::begin (bytes_);
    EXPECT_EQ (0b00000100, *(first++));
    EXPECT_EQ (0b00000000, *(first++));
    EXPECT_EQ (0b00000010, *(first++));
    std::vector<std::uint8_t> const body (first, std::end (bytes_));
    std::vector<std::uint8_t> const expected_body (src_length, src_char);

    EXPECT_THAT (body, ::testing::ContainerEq (expected_body));
    EXPECT_EQ (bytes_.size (), writer_.bytes_consumed ());
    EXPECT_EQ (bytes_.size (), writer_.bytes_produced ());
}